

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

MD_MARKSTACK * md_opener_stack(MD_CTX *ctx,int mark_index)

{
  MD_MARK *pMVar1;
  char cVar2;
  int in_ESI;
  MD_CTX *in_RDI;
  MD_MARK *mark;
  MD_MARKSTACK *local_30;
  MD_MARKSTACK *local_8;
  
  pMVar1 = in_RDI->marks + in_ESI;
  cVar2 = pMVar1->ch;
  if (cVar2 == '!') {
LAB_001133d5:
    local_8 = in_RDI->opener_stacks + 0xe;
  }
  else {
    if (cVar2 != '*') {
      if (cVar2 == '[') goto LAB_001133d5;
      if (cVar2 != '_') {
        if (cVar2 != '~') {
          return local_8;
        }
        if (pMVar1->end - pMVar1->beg == 1) {
          local_30 = in_RDI->opener_stacks + 0xc;
        }
        else {
          local_30 = in_RDI->opener_stacks + 0xd;
        }
        return local_30;
      }
    }
    local_8 = md_emph_stack(in_RDI,pMVar1->ch,(uint)pMVar1->flags);
  }
  return local_8;
}

Assistant:

static MD_MARKSTACK*
md_opener_stack(MD_CTX* ctx, int mark_index)
{
    MD_MARK* mark = &ctx->marks[mark_index];

    switch(mark->ch) {
        case _T('*'):
        case _T('_'):   return md_emph_stack(ctx, mark->ch, mark->flags);

        case _T('~'):   return (mark->end - mark->beg == 1) ? &TILDE_OPENERS_1 : &TILDE_OPENERS_2;

        case _T('!'):
        case _T('['):   return &BRACKET_OPENERS;

        default:        MD_UNREACHABLE();
    }
}